

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O3

void __thiscall
coro_io::multithread_context_pool::multithread_context_pool
          (multithread_context_pool *this,size_t thd_num)

{
  atomic_count *paVar1;
  impl_type *piVar2;
  work *pwVar3;
  pointer *__ptr;
  basic_executor_type<std::allocator<void>,_0UL> local_20;
  
  asio::io_context::io_context(&this->ioc_);
  pwVar3 = (work *)operator_new(8);
  piVar2 = (this->ioc_).impl_;
  pwVar3->io_context_impl_ = piVar2;
  LOCK();
  paVar1 = &piVar2->outstanding_work_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  (this->work_)._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = pwVar3;
  local_20.target_ = (uintptr_t)this;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(&this->executor_,&local_20);
  this->thd_num_ = thd_num;
  (this->thds_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thds_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thds_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::promise<void>::promise(&this->promise_);
  return;
}

Assistant:

multithread_context_pool(size_t thd_num = std::thread::hardware_concurrency())
      : work_(std::make_unique<asio::io_context::work>(ioc_)),
        executor_(ioc_.get_executor()),
        thd_num_(thd_num) {}